

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

TablePrinter * Catch::operator<<(TablePrinter *tp,Duration *value)

{
  ostream *poVar1;
  double dVar2;
  size_type __dnew;
  long *local_50;
  long local_48;
  long local_40 [2];
  long local_30;
  
  dVar2 = value->m_inNanoseconds;
  switch(value->m_units) {
  case Microseconds:
    dVar2 = dVar2 / 1000.0;
    break;
  case Milliseconds:
    dVar2 = dVar2 / 1000000.0;
    break;
  case Seconds:
    dVar2 = dVar2 / 1000000000.0;
    break;
  case Minutes:
    dVar2 = dVar2 / 60000000000.0;
  }
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  local_50 = (long *)CONCAT71(local_50._1_7_,0x20);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_50,1);
  local_50 = local_40;
  switch(value->m_units) {
  case Nanoseconds:
    local_40[0] = CONCAT62(local_40[0]._2_6_,0x736e);
    break;
  case Microseconds:
    local_40[0] = CONCAT62(local_40[0]._2_6_,0x7375);
    break;
  case Milliseconds:
    local_40[0] = CONCAT62(local_40[0]._2_6_,0x736d);
    break;
  case Seconds:
    local_40[0] = CONCAT62(local_40[0]._2_6_,0x73);
    goto LAB_0018e73d;
  case Minutes:
    local_40[0] = CONCAT62(local_40[0]._2_6_,0x6d);
LAB_0018e73d:
    local_48 = 1;
    goto LAB_0018e7a9;
  default:
    local_30 = 0x14;
    local_50 = (long *)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_30);
    local_40[0] = local_30;
    *local_50 = 0x7265746e69202a2a;
    local_50[1] = 0x6f727265206c616e;
    *(undefined4 *)(local_50 + 2) = 0x2a2a2072;
    local_48 = local_30;
    *(char *)((long)local_50 + local_30) = '\0';
    goto LAB_0018e7a9;
  }
  local_48 = 2;
  local_40[0]._0_3_ = (uint3)(ushort)local_40[0];
LAB_0018e7a9:
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return tp;
}

Assistant:

TablePrinter& operator << (TablePrinter& tp, T const& value) {
        tp.m_oss << value;
        return tp;
    }